

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

void msg_flush_split_existing(wchar_t w,int *x)

{
  wchar_t local_3c;
  wchar_t local_38;
  int local_34;
  wchar_t c;
  wchar_t a;
  int *sva;
  wchar_t *svc;
  wchar_t i;
  wchar_t split;
  int *x_local;
  wchar_t w_local;
  
  if (w + L'\xfffffff8' < *x) {
    local_3c = w + L'\xfffffff8';
  }
  else {
    local_3c = *x;
  }
  svc._4_4_ = local_3c;
  svc._0_4_ = local_3c;
  sva = (int *)0x0;
  _c = (void *)0x0;
  _i = x;
  x_local._4_4_ = w;
  do {
    if ((wchar_t)svc <= x_local._4_4_ / 2) goto LAB_0022acd4;
    svc._0_4_ = (wchar_t)svc + L'\xffffffff';
    Term_what((wchar_t)svc,L'\0',&local_34,&local_38);
  } while (local_38 != L' ');
  svc._4_4_ = (wchar_t)svc;
LAB_0022acd4:
  *_i = *_i - svc._4_4_;
  if (L'\0' < *_i) {
    sva = (int *)mem_alloc((long)*_i << 2);
    _c = mem_alloc((long)*_i << 2);
    for (svc._0_4_ = L'\0'; (wchar_t)svc < *_i; svc._0_4_ = (wchar_t)svc + L'\x01') {
      Term_what((wchar_t)svc + svc._4_4_,L'\0',(int *)((long)_c + (long)(wchar_t)svc * 4),
                sva + (wchar_t)svc);
    }
  }
  Term_erase(svc._4_4_,L'\0',x_local._4_4_);
  msg_flush(svc._4_4_ + L'\x01');
  if (L'\0' < *_i) {
    for (svc._0_4_ = L'\0'; (wchar_t)svc < *_i; svc._0_4_ = (wchar_t)svc + L'\x01') {
      Term_putch((wchar_t)svc,L'\0',*(wchar_t *)((long)_c + (long)(wchar_t)svc * 4),
                 sva[(wchar_t)svc]);
    }
    mem_free(_c);
    mem_free(sva);
  }
  return;
}

Assistant:

static void msg_flush_split_existing(int w, int *x)
{
	/* Default place to split what's there */
	int split = MIN(*x, w - 8);
	int i = split;
	wchar_t *svc = NULL;
	int *sva = NULL;

	/* Find the rightmost split point. */
	while (i > w / 2) {
		int a;
		wchar_t c;

		--i;
		Term_what(i, 0, &a, &c);
		if (c == L' ') {
			split = i;
			break;
		}
	}

	/* Remember what's on and after the split point. */
	*x -= split;
	if (*x > 0) {
		svc = mem_alloc(*x * sizeof(*svc));
		sva = mem_alloc(*x * sizeof(*sva));
		for (i = 0; i < *x; ++i) {
			Term_what(i + split, 0, &sva[i], &svc[i]);
		}
	}

	Term_erase(split, 0, w);
	msg_flush(split + 1);

	/* Put back what was remembered. */
	if (*x > 0) {
		for (i = 0; i < *x; ++i) {
			Term_putch(i, 0, sva[i], svc[i]);
		}
		mem_free(sva);
		mem_free(svc);
	}
}